

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O2

int __thiscall
raspicam::_private::Private_Impl::convertFormat(Private_Impl *this,RASPICAM_FORMAT fmt)

{
  int iVar1;
  
  iVar1 = 0x30323449;
  if (fmt < RASPICAM_FORMAT_IGNORE) {
    iVar1 = *(int *)(&DAT_0010c060 + (ulong)fmt * 4);
  }
  return iVar1;
}

Assistant:

int Private_Impl::convertFormat ( RASPICAM_FORMAT fmt ) {
            switch ( fmt ) {
            case RASPICAM_FORMAT_RGB:
                return MMAL_ENCODING_RGB24;
            case RASPICAM_FORMAT_BGR:
                return MMAL_ENCODING_BGR24;
            case RASPICAM_FORMAT_GRAY:
                return MMAL_ENCODING_I420;
            case RASPICAM_FORMAT_YUV420:
                return MMAL_ENCODING_I420;
            default:
                return MMAL_ENCODING_I420;
            }
        }